

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O2

void __thiscall TPZFBMatrix<double>::TPZFBMatrix(TPZFBMatrix<double> *this)

{
  TPZMatrix<double>::TPZMatrix(&this->super_TPZMatrix<double>,&PTR_PTR_016985d8,0,0);
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFBMatrix_01698358;
  (this->fElem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
  (this->fElem).fStore = (double *)0x0;
  (this->fElem).fNElements = 0;
  (this->fElem).fNAlloc = 0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  this->fBandLower = 0;
  this->fBandUpper = 0;
  return;
}

Assistant:

TPZFBMatrix<TVar>::TPZFBMatrix()
: TPZRegisterClassId(&TPZFBMatrix::ClassId),
TPZMatrix<TVar>( 0, 0 ), fElem()
{
	fBandLower = 0;
    fBandUpper = 0;
}